

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tetgen.h
# Opt level: O0

void __thiscall tetgenmesh::tssbond1(tetgenmesh *this,triface *t,face *s)

{
  tetrahedron ppdVar1;
  shellface ppdVar2;
  int local_24;
  int i;
  face *s_local;
  triface *t_local;
  tetgenmesh *this_local;
  
  if (t->tet[8] == (tetrahedron)0x0) {
    ppdVar1 = (tetrahedron)memorypool::alloc(this->tet2segpool);
    t->tet[8] = ppdVar1;
    for (local_24 = 0; local_24 < 6; local_24 = local_24 + 1) {
      t->tet[8][local_24] = (double *)0x0;
    }
  }
  ppdVar2 = sencode(this,s);
  t->tet[8][ver2edge[t->ver]] = (double *)ppdVar2;
  return;
}

Assistant:

inline void tetgenmesh::tssbond1(triface& t, face& s)
{
  if ((t).tet[8] == NULL) {
    // Allocate space for this tet.
    (t).tet[8] = (tetrahedron) tet2segpool->alloc();
    // Initialization.
    for (int i = 0; i < 6; i++) {
      ((shellface *) (t).tet[8])[i] = NULL;
    }
  }
  ((shellface *) (t).tet[8])[ver2edge[(t).ver]] = sencode((s)); 
}